

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O3

Variable * __thiscall soul::BlockBuilder::createRegisterVariable(BlockBuilder *this,Type *type)

{
  Variable *pVVar1;
  Identifier local_28;
  Type local_20;
  
  local_20.category = type->category;
  local_20.arrayElementCategory = type->arrayElementCategory;
  local_20.isRef = type->isRef;
  local_20.isConstant = type->isConstant;
  local_20.primitiveType.type = (type->primitiveType).type;
  local_20.boundingSize = type->boundingSize;
  local_20.arrayElementBoundingSize = type->arrayElementBoundingSize;
  local_20.structure.object = (type->structure).object;
  (type->structure).object = (Structure *)0x0;
  local_28.name = (string *)0x0;
  pVVar1 = createVariable<soul::Identifier>(this,&local_20,&local_28,constant);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_20.structure.object);
  return pVVar1;
}

Assistant:

virtual ~BlockBuilder() {}